

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_ns.c
# Opt level: O3

ENCODING * findEncodingNS(ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  long lVar2;
  char *p;
  char buf [128];
  char *local_b8;
  char *local_b0;
  char local_a8 [127];
  char local_29 [9];
  
  local_b8 = local_a8;
  local_b0 = ptr;
  (*enc->utf8Convert)(enc,&local_b0,end,&local_b8,local_29);
  if (local_b0 == end) {
    *local_b8 = '\0';
    iVar1 = streqci(local_a8,"UTF-16");
    if ((iVar1 == 0) || (enc->minBytesPerChar != 2)) {
      enc = (ENCODING *)0x0;
      lVar2 = 0;
      do {
        iVar1 = streqci(local_a8,*(char **)((long)getEncodingIndex::encodingNames + lVar2));
        if (iVar1 != 0) {
          return *(ENCODING **)((long)encodingsNS + lVar2);
        }
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x30);
    }
  }
  else {
    enc = (ENCODING *)0x0;
  }
  return enc;
}

Assistant:

static
const ENCODING *NS(findEncoding)(const ENCODING *enc, const char *ptr, const char *end)
{
#define ENCODING_MAX 128
  char buf[ENCODING_MAX];
  char *p = buf;
  int i;
  XmlUtf8Convert(enc, &ptr, end, &p, p + ENCODING_MAX - 1);
  if (ptr != end)
    return 0;
  *p = 0;
  if (streqci(buf, KW_UTF_16) && enc->minBytesPerChar == 2)
    return enc;
  i = getEncodingIndex(buf);
  if (i == UNKNOWN_ENC)
    return 0;
  return NS(encodings)[i];
}